

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Promise<unsigned_long> __thiscall
kj::PausableReadAsyncIoStream::tryReadImpl
          (PausableReadAsyncIoStream *this,void *buffer,size_t minBytes,size_t maxBytes)

{
  PromiseArenaMember *node;
  PromiseArenaMember *local_570 [10];
  AsyncInputStream local_520 [5];
  Deferred<kj::Function<void_()>_> local_4f8 [51];
  
  (this->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream = (_func_int **)0x0;
  (**(code **)(**(long **)((long)buffer + 0x18) + 8))(local_570);
  trackRead(local_4f8,(PausableReadAsyncIoStream *)buffer);
  Promise<unsigned_long>::attach<kj::_::Deferred<kj::Function<void()>>>
            ((Promise<unsigned_long> *)local_520,(Deferred<kj::Function<void_()>_> *)local_570);
  kj::_::Deferred<kj::Function<void_()>_>::~Deferred(local_4f8);
  node = local_570[0];
  if (local_570[0] != (PromiseArenaMember *)0x0) {
    local_570[0] = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose(node);
  }
  (this->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream =
       local_520[0]._vptr_AsyncInputStream;
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<size_t> PausableReadAsyncIoStream::tryReadImpl(
    void* buffer, size_t minBytes, size_t maxBytes) {
  // Hack: evalNow used here because `newAdaptedPromise` has a bug. We may need to change
  // `PromiseDisposer::alloc` to not be `noexcept` but in order to do so we'll need to benchmark
  // its performance.
  return kj::evalNow([&]() -> kj::Promise<size_t> {
    return inner->tryRead(buffer, minBytes, maxBytes).attach(trackRead());
  });
}